

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>,3,0>
       ::run<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
                 (redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *xpr)

{
  long lVar1;
  PointerType pdVar2;
  long lVar3;
  Index index;
  Index IVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  lVar1 = (xpr->
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          ).super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_rows.m_value;
  IVar4 = first_aligned_impl<16,_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_false>
          ::run(xpr);
  lVar6 = lVar1 - IVar4;
  pdVar2 = (eval->
           super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
           ).
           super_block_evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
  if (lVar6 + 1U < 3) {
    dVar8 = *pdVar2;
    for (lVar6 = 1; lVar6 < lVar1; lVar6 = lVar6 + 1) {
      dVar8 = dVar8 + pdVar2[lVar6];
    }
  }
  else {
    dVar11 = pdVar2[IVar4];
    dVar8 = (pdVar2 + IVar4)[1];
    if (3 < lVar6) {
      lVar5 = IVar4 + (lVar6 / 4) * 4;
      dVar9 = pdVar2[IVar4 + 2];
      dVar10 = (pdVar2 + IVar4 + 2)[1];
      lVar3 = IVar4;
      while (lVar7 = lVar3 + 4, lVar7 < lVar5) {
        dVar11 = dVar11 + pdVar2[lVar7];
        dVar8 = dVar8 + (pdVar2 + lVar7)[1];
        dVar9 = dVar9 + pdVar2[lVar3 + 6];
        dVar10 = dVar10 + (pdVar2 + lVar3 + 6)[1];
        lVar3 = lVar7;
      }
      dVar11 = dVar11 + dVar9;
      dVar8 = dVar8 + dVar10;
      if ((lVar6 / 4) * 4 < (lVar6 / 2) * 2) {
        dVar11 = dVar11 + pdVar2[lVar5];
        dVar8 = dVar8 + (pdVar2 + lVar5)[1];
      }
    }
    lVar6 = IVar4 + (lVar6 / 2) * 2;
    dVar8 = dVar8 + dVar11;
    lVar5 = 0;
    if (IVar4 < 1) {
      IVar4 = lVar5;
    }
    for (; IVar4 != lVar5; lVar5 = lVar5 + 1) {
      dVar8 = dVar8 + pdVar2[lVar5];
    }
    for (; lVar6 < lVar1; lVar6 = lVar6 + 1) {
      dVar8 = dVar8 + pdVar2[lVar6];
    }
  }
  return dVar8;
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }